

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O0

void Diligent::BasicFileSystem::CorrectSlashes(String *Path,Char Slash)

{
  bool bVar1;
  Char *Message;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char local_61;
  char local_45 [8];
  Char RevSlashSym;
  undefined1 local_38 [8];
  string msg;
  Char Slash_local;
  String *Path_local;
  
  if (Slash == '\0') {
    msg.field_2._M_local_buf[0xf] = '/';
  }
  else {
    msg.field_2._M_local_buf[0xf] = Slash;
    bVar1 = IsSlash(Slash);
    if (!bVar1) {
      FormatString<char[23]>((string *)local_38,(char (*) [23])"Incorrect slash symbol");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"CorrectSlashes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
                 ,99);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  local_61 = '/';
  if (msg.field_2._M_local_buf[0xf] != '\\') {
    local_61 = '\\';
  }
  local_45[0] = local_61;
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,__last,local_45,msg.field_2._M_local_buf + 0xf);
  return;
}

Assistant:

void BasicFileSystem::CorrectSlashes(String& Path, Char Slash)
{
    if (Slash != 0)
        DEV_CHECK_ERR(IsSlash(Slash), "Incorrect slash symbol");
    else
        Slash = SlashSymbol;
    Char RevSlashSym = (Slash == '\\') ? '/' : '\\';
    std::replace(Path.begin(), Path.end(), RevSlashSym, Slash);
}